

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
ConnectTrace::BlockConnected
          (ConnectTrace *this,CBlockIndex *pindex,shared_ptr<const_CBlock> *pblock)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  shared_ptr<const_CBlock> *in_RDX;
  CBlockIndex *in_RSI;
  vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *in_RDI;
  long in_FS_OFFSET;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::back
                     ((vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *)
                      in_stack_ffffffffffffffc8);
  if (pvVar3->pindex != (CBlockIndex *)0x0) {
    __assert_fail("!blocksConnected.back().pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc1f,
                  "void ConnectTrace::BlockConnected(CBlockIndex *, std::shared_ptr<const CBlock>)")
    ;
  }
  if (in_RSI == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc20,
                  "void ConnectTrace::BlockConnected(CBlockIndex *, std::shared_ptr<const CBlock>)")
    ;
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_stack_ffffffffffffffc8);
  if (!bVar2) {
    __assert_fail("pblock",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc21,
                  "void ConnectTrace::BlockConnected(CBlockIndex *, std::shared_ptr<const CBlock>)")
    ;
  }
  pvVar3 = std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::back
                     ((vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *)in_RSI)
  ;
  pvVar3->pindex = in_RSI;
  std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::back
            ((vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *)in_RSI);
  std::shared_ptr<const_CBlock>::operator=((shared_ptr<const_CBlock> *)in_RDI,in_RDX);
  std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::emplace_back<>(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockConnected(CBlockIndex* pindex, std::shared_ptr<const CBlock> pblock) {
        assert(!blocksConnected.back().pindex);
        assert(pindex);
        assert(pblock);
        blocksConnected.back().pindex = pindex;
        blocksConnected.back().pblock = std::move(pblock);
        blocksConnected.emplace_back();
    }